

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O3

ngx_int_t ngx_strncasecmp(u_char *s1,u_char *s2,size_t n)

{
  byte bVar1;
  byte bVar2;
  ngx_int_t nVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  if (n == 0) {
    nVar3 = 0;
  }
  else {
    lVar4 = 0;
    do {
      bVar1 = s1[lVar4];
      bVar2 = s2[lVar4];
      uVar5 = (ulong)bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        uVar5 = (ulong)bVar1;
      }
      uVar6 = (ulong)bVar2 | 0x20;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        uVar6 = (ulong)bVar2;
      }
      nVar3 = uVar5 - uVar6;
    } while (((uVar5 - uVar6 == 0) && (nVar3 = 0, uVar5 != 0)) &&
            (bVar7 = n - 1 != lVar4, lVar4 = lVar4 + 1, bVar7));
  }
  return nVar3;
}

Assistant:

ngx_int_t
ngx_strncasecmp(u_char *s1, u_char *s2, size_t n)
{
    ngx_uint_t  c1, c2;

    while (n) {
        c1 = (ngx_uint_t) *s1++;
        c2 = (ngx_uint_t) *s2++;

        c1 = (c1 >= 'A' && c1 <= 'Z') ? (c1 | 0x20) : c1;
        c2 = (c2 >= 'A' && c2 <= 'Z') ? (c2 | 0x20) : c2;

        if (c1 == c2) {

            if (c1) {
                n--;
                continue;
            }

            return 0;
        }

        return c1 - c2;
    }

    return 0;
}